

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

float __thiscall TC_parser<true>::featureValue(TC_parser<true> *this)

{
  bool bVar1;
  long in_RDI;
  char **unaff_retaddr;
  char *in_stack_00000008;
  char *end_read;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  TC_parser<true> *in_stack_000000d0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  float fVar2;
  
  if ((((**(char **)(in_RDI + 8) == ' ') || (**(char **)(in_RDI + 8) == '\t')) ||
      (**(char **)(in_RDI + 8) == '|')) ||
     ((*(long *)(in_RDI + 8) == *(long *)(in_RDI + 0x10) || (**(char **)(in_RDI + 8) == '\r')))) {
    fVar2 = 1.0;
  }
  else if (**(char **)(in_RDI + 8) == ':') {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    fVar2 = parseFloat(in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    *(float *)(in_RDI + 0x3c) = fVar2;
    if (*(long *)(in_RDI + 8) == 0) {
      parserWarning(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                    in_stack_000000b0);
    }
    bVar1 = nanpattern(0.0);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0x3c) = 0;
      parserWarning(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                    in_stack_000000b0);
    }
    *(undefined8 *)(in_RDI + 8) = 0;
    fVar2 = *(float *)(in_RDI + 0x3c);
  }
  else {
    parserWarning(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                  in_stack_000000b0);
    fVar2 = 0.0;
  }
  return fVar2;
}

Assistant:

inline float featureValue()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
      return 1.;
    else if (*reading_head == ':')
    {
      // featureValue --> ':' 'Float'
      ++reading_head;
      char* end_read = nullptr;
      v = parseFloat(reading_head, &end_read, endLine);
      if (end_read == reading_head)
      {
        parserWarning("malformed example! Float expected after : \"", beginLine, reading_head, "\"");
      }
      if (nanpattern(v))
      {
        v = 0.f;
        parserWarning("warning: invalid feature value:\"", reading_head, end_read, "\" read as NaN. Replacing with 0.");
      }
      reading_head = end_read;
      return v;
    }
    else
    {
      // syntax error
      parserWarning("malformed example! '|', ':', space, or EOL expected after : \"", beginLine, reading_head, "\"");
      return 0.f;
    }
  }